

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighborhoods.cpp
# Opt level: O0

NeighborIndices __thiscall lume::Neighborhoods::neighbor_indices(Neighborhoods *this,GrobIndex gi)

{
  index_t iVar1;
  index_t iVar2;
  LumeError *this_00;
  string *what;
  allocator local_59;
  string local_58 [36];
  GrobIndex local_34;
  index_t local_2c;
  Neighborhoods *pNStack_28;
  index_t baseIndex;
  Neighborhoods *this_local;
  GrobIndex gi_local;
  
  local_34 = gi;
  pNStack_28 = this;
  this_local = (Neighborhoods *)gi;
  iVar1 = base_index(this,gi);
  local_2c = iVar1;
  iVar2 = ArrayAnnex<unsigned_int>::size(&this->m_offsets);
  if (iVar2 <= iVar1) {
    this_00 = (LumeError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,"This Neighborhoods instance doesn\'t provide neighbors for grobs of type ",
               &local_59);
    GrobName_abi_cxx11_((grob_t)this_local);
    what = (string *)std::__cxx11::string::append(local_58);
    LumeError::LumeError(this_00,what);
    __cxa_throw(this_00,&LumeError::typeinfo,LumeError::~LumeError);
  }
  NeighborIndices::NeighborIndices((NeighborIndices *)&gi_local,(GrobIndex *)&this_local,this);
  return _gi_local;
}

Assistant:

NeighborIndices Neighborhoods::
neighbor_indices (const GrobIndex gi) const
{
	const index_t baseIndex = base_index (gi);

	if (baseIndex >= m_offsets.size())
		throw LumeError (std::string("This Neighborhoods instance doesn't provide "
		                             "neighbors for grobs of type ")
						.append (GrobName (gi.grobType)));

	return NeighborIndices (gi, this);
}